

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorPoolDatabase::FindFileContainingExtension
          (DescriptorPoolDatabase *this,StringViewArg containing_type,int field_number,
          FileDescriptorProto *output)

{
  Descriptor *extendee;
  FieldDescriptor *pFVar1;
  string_view name;
  
  name._M_str = (containing_type->_M_dataplus)._M_p;
  name._M_len = containing_type->_M_string_length;
  extendee = DescriptorPool::FindMessageTypeByName(this->pool_,name);
  if ((extendee != (Descriptor *)0x0) &&
     (pFVar1 = DescriptorPool::FindExtensionByNumber(this->pool_,extendee,field_number),
     pFVar1 != (FieldDescriptor *)0x0)) {
    FileDescriptorProto::Clear(output);
    FileDescriptor::CopyTo(pFVar1->file_,output);
    if ((this->options_).preserve_source_code_info != true) {
      return true;
    }
    FileDescriptor::CopySourceCodeInfoTo(pFVar1->file_,output);
    return true;
  }
  return false;
}

Assistant:

bool DescriptorPoolDatabase::FindFileContainingExtension(
    StringViewArg containing_type, int field_number,
    FileDescriptorProto* PROTOBUF_NONNULL output) {
  const Descriptor* extendee = pool_.FindMessageTypeByName(containing_type);
  if (extendee == nullptr) return false;

  const FieldDescriptor* extension =
      pool_.FindExtensionByNumber(extendee, field_number);
  if (extension == nullptr) return false;

  output->Clear();
  extension->file()->CopyTo(output);
  if (options_.preserve_source_code_info) {
    extension->file()->CopySourceCodeInfoTo(output);
  }
  return true;
}